

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

void __thiscall
llm_graph_input_out_ids::set_input(llm_graph_input_out_ids *this,llama_ubatch *ubatch)

{
  uint uVar1;
  int *piVar2;
  int8_t *piVar3;
  undefined1 auVar4 [16];
  char cVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if ((this->hparams->causal_attn != false) ||
     (this->cparams->pooling_type == LLAMA_POOLING_TYPE_NONE)) {
    if (this->out_ids == (ggml_tensor *)0x0) {
      llama_log_internal(GGML_LOG_LEVEL_WARN,"%s: \'out_ids\' is not created\n","set_input");
      return;
    }
    uVar1 = ubatch->n_tokens;
    uVar10 = (ulong)uVar1;
    cVar5 = ggml_backend_buffer_is_host(this->out_ids->buffer);
    auVar4 = _DAT_002350d0;
    if (cVar5 == '\0') {
      pcVar6 = "ggml_backend_buffer_is_host(out_ids->buffer)";
      uVar9 = 0x7f;
LAB_001aa3f0:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,uVar9,"GGML_ASSERT(%s) failed",pcVar6);
    }
    piVar2 = (int *)this->out_ids->data;
    iVar8 = this->n_outputs;
    if ((long)iVar8 == uVar10) {
      if (uVar10 != 0) {
        lVar11 = uVar10 - 1;
        auVar12._8_4_ = (int)lVar11;
        auVar12._0_8_ = lVar11;
        auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
        uVar7 = 0;
        auVar12 = auVar12 ^ _DAT_002350d0;
        auVar13 = _DAT_002350c0;
        do {
          auVar14 = auVar13 ^ auVar4;
          if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                      auVar12._4_4_ < auVar14._4_4_) & 1)) {
            piVar2[uVar7] = (int)uVar7;
          }
          if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
              auVar14._12_4_ <= auVar12._12_4_) {
            piVar2[uVar7 + 1] = (int)uVar7 + 1;
          }
          uVar7 = uVar7 + 2;
          lVar11 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar11 + 2;
        } while ((uVar10 + 1 & 0xfffffffffffffffe) != uVar7);
      }
    }
    else {
      piVar3 = ubatch->output;
      if (piVar3 == (int8_t *)0x0) {
        if (iVar8 != 0) {
          if (iVar8 != 1) {
            pcVar6 = "n_outputs == 0";
            uVar9 = 0x93;
            goto LAB_001aa3f0;
          }
          *piVar2 = uVar1 - 1;
        }
      }
      else if (uVar10 != 0) {
        uVar7 = 0;
        iVar8 = 0;
        do {
          if (piVar3[uVar7] != '\0') {
            lVar11 = (long)iVar8;
            iVar8 = iVar8 + 1;
            piVar2[lVar11] = (int)uVar7;
          }
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_out_ids::set_input(const llama_ubatch * ubatch) {
    if (hparams.causal_attn || cparams.pooling_type == LLAMA_POOLING_TYPE_NONE) {
        //GGML_ASSERT(out_ids && "every model that can must skip unused outputs");

        if (!out_ids) {
            LLAMA_LOG_WARN("%s: 'out_ids' is not created\n", __func__);
        } else {
            const int64_t n_tokens = ubatch->n_tokens;

            GGML_ASSERT(ggml_backend_buffer_is_host(out_ids->buffer));
            int32_t * data = (int32_t *) out_ids->data;

            if (n_outputs == n_tokens) {
                for (int i = 0; i < n_tokens; ++i) {
                    data[i] = i;
                }
            } else if (ubatch->output) {
                int32_t n_outputs = 0;
                for (int i = 0; i < n_tokens; ++i) {
                    if (ubatch->output[i]) {
                        data[n_outputs++] = i;
                    }
                }
                // the graph needs to have been passed the correct number of outputs
                GGML_ASSERT(n_outputs == n_outputs);
            } else if (n_outputs == 1) {
                // only keep last output
                data[0] = n_tokens - 1;
            } else {
                GGML_ASSERT(n_outputs == 0);
            }
        }
    }
}